

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetJoin.cpp
# Opt level: O2

void __thiscall
SetJoinIRCCommand::trigger
          (SetJoinIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  Config *pCVar1;
  undefined8 uVar2;
  allocator<char> local_59;
  char *local_58;
  string local_50 [32];
  
  pCVar1 = pluginInstance.setjoin_file;
  local_58 = channel._M_str;
  if (parameters._M_len != 0) {
    uVar2 = Jupiter::IRC::Client::getConfigSection();
    uVar2 = Jupiter::Config::operator[](pCVar1,uVar2);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_50,&parameters,&local_59);
    Jupiter::Config::set(uVar2,nick._M_len,nick._M_str,local_50);
    std::__cxx11::string::~string(local_50);
    Jupiter::Config::write();
    Jupiter::IRC::Client::sendMessage
              (source,channel._M_len,local_58,0x1f,"Your join message has been set.");
    return;
  }
  Jupiter::IRC::Client::sendMessage
            (source,channel._M_len,local_58,0x2d,"Too few parameters! Syntax: setjoin <message>");
  return;
}

Assistant:

void SetJoinIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		pluginInstance.setjoin_file[source->getConfigSection()].set(nick, static_cast<std::string>(parameters));
		pluginInstance.setjoin_file.write();
		source->sendMessage(channel, "Your join message has been set."sv);
	}
	else source->sendMessage(channel, "Too few parameters! Syntax: setjoin <message>"sv);
}